

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Text>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  WirePointer *pWVar1;
  uint uVar2;
  word *pwVar3;
  size_t sVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  WirePointer *pWVar10;
  ulong uVar11;
  WirePointer *pWVar12;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  WirePointer *pWVar13;
  bool bVar14;
  Reader RVar15;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *newSegment;
  SegmentReader *local_38;
  uint size;
  
  this_00 = &_kjCondition;
  local_38 = this->segment;
  pWVar10 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar10 = this->pointer;
  }
  uVar2 = (uint)*(uint64_t *)&(pWVar10->offsetAndKind).value;
  if (local_38 == (SegmentReader *)0x0) {
    local_38 = (SegmentReader *)0x0;
    if ((pWVar10->field_1).upper32Bits == 0 && uVar2 == 0) goto LAB_0017e66d;
    pWVar13 = pWVar10 + (long)((int)uVar2 >> 2) + 1;
LAB_0017e375:
    this_00 = &_kjCondition;
    uVar2 = (pWVar10->field_1).upper32Bits;
    size = uVar2 >> 3;
    uVar8 = (uint)*(uint64_t *)&(pWVar10->offsetAndKind).value & 3;
    _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar8);
    _kjCondition.right = " == ";
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 1);
    if (uVar8 == 1) {
      _kjCondition.left =
           (SegmentReader **)
           (CONCAT71(_kjCondition.left._1_7_,*(byte *)&pWVar10->field_1) & 0xffffffffffffff07);
      _kjCondition.left._0_2_ = CONCAT11(2,_kjCondition.left._0_1_);
      _kjCondition.right = " == ";
      _kjCondition.op.content.ptr = (char *)0x5;
      bVar14 = (*(byte *)&pWVar10->field_1 & 7) == 2;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar14);
      if (bVar14) {
        if (local_38 == (SegmentReader *)0x0) {
LAB_0017e596:
          _kjCondition.result = uVar2 >= 8;
          _kjCondition.left = (SegmentReader **)&size;
          _kjCondition.right = (void *)0x0;
          _kjCondition.op.content.ptr = " > ";
          _kjCondition.op.content.size_ = 4;
          if (uVar2 < 8) {
            this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[50]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x9b0,FAILED,"size > ZERO * BYTES",
                       "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                       (DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                       (char (*) [50])"Message contains text that is not NUL-terminated.");
          }
          else {
            uVar7 = (ulong)(size - 1);
            _kjCondition.result = *(char *)((long)&(pWVar13->offsetAndKind).value + uVar7) == '\0';
            _kjCondition.left = (SegmentReader **)((long)&(pWVar13->offsetAndKind).value + uVar7);
            _kjCondition.right = (void *)0x0;
            _kjCondition.op.content.ptr = " == ";
            _kjCondition.op.content.size_ = 5;
            if (_kjCondition.result) goto LAB_0017e67d;
            this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<char_const&,char>&,char_const(&)[50]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x9b7,FAILED,"cptr[unboundedSize] == \'\\0\'",
                       "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                       (DebugComparison<const_char_&,_char> *)&_kjCondition,
                       (char (*) [50])"Message contains text that is not NUL-terminated.");
          }
        }
        else {
          uVar7 = (ulong)(size + 7 >> 3);
          if (((long)pWVar13 - (long)(local_38->ptr).ptr >> 3) + uVar7 <= (local_38->ptr).size_) {
            uVar11 = local_38->readLimiter->limit;
            if (uVar7 <= uVar11) {
              local_38->readLimiter->limit = uVar11 - uVar7;
              goto LAB_0017e596;
            }
            (*local_38->arena->_vptr_Arena[3])();
          }
          newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9ac,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                     "_kjCondition,\"Message contained out-of-bounds text pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [320])
                     "Message contained out-of-bounds text pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
        }
      }
      else {
        this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9a6,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where text was \" \"expected.\""
                   ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [85])
                   "Schema mismatch: Message contains list pointer of non-bytes where text was expected."
                  );
      }
    }
    else {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x9a0,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Message contains non-list pointer where text was expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [76])
                 "Schema mismatch: Message contains non-list pointer where text was expected.");
    }
LAB_0017e661:
    kj::_::Debug::Fault::~Fault((Fault *)this_00);
  }
  else {
    pwVar3 = (local_38->ptr).ptr;
    if ((pWVar10->field_1).upper32Bits != 0 || uVar2 != 0) {
      pWVar12 = (WirePointer *)(pwVar3 + (local_38->ptr).size_);
      lVar9 = (long)((int)uVar2 >> 2);
      pWVar13 = pWVar10 + lVar9 + 1;
      if ((long)pWVar12 - (long)(pWVar10 + 1) >> 3 < lVar9) {
        pWVar13 = pWVar12;
      }
      if (lVar9 < (long)pwVar3 - (long)(pWVar10 + 1) >> 3) {
        pWVar13 = pWVar12;
      }
      if ((uVar2 & 3) == 2) {
        iVar5 = (*local_38->arena->_vptr_Arena[2])();
        local_38 = (SegmentReader *)CONCAT44(extraout_var,iVar5);
        _kjCondition.left = &local_38;
        _kjCondition.right = (void *)0x0;
        _kjCondition.op.content.ptr = " != ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = local_38 != (SegmentReader *)0x0;
        if (local_38 == (SegmentReader *)0x0) {
          this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                    ((Fault *)this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x244,FAILED,"segment != nullptr",
                     "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                     &_kjCondition,(char (*) [49])"Message contains far pointer to unknown segment."
                    );
        }
        else {
          uVar2 = (uint)*(uint64_t *)&(pWVar10->offsetAndKind).value;
          uVar11 = (ulong)(uVar2 >> 3);
          uVar7 = (local_38->ptr).size_;
          if ((long)uVar7 < (long)uVar11) {
            uVar11 = uVar7;
          }
          uVar6 = 2 - (ulong)((uVar2 & 4) == 0);
          if (uVar6 + uVar11 <= uVar7) {
            pWVar12 = (WirePointer *)((local_38->ptr).ptr + uVar11);
            uVar7 = local_38->readLimiter->limit;
            if (uVar6 <= uVar7) {
              local_38->readLimiter->limit = uVar7 - uVar6;
              if ((*(uint64_t *)&(pWVar10->offsetAndKind).value & 4) == 0) {
                pWVar1 = pWVar12 + 1;
                lVar9 = (long)((int)*(uint64_t *)&(pWVar12->offsetAndKind).value >> 2);
                pWVar10 = pWVar12;
                if ((local_38 == (SegmentReader *)0x0) ||
                   ((pwVar3 = (local_38->ptr).ptr,
                    pWVar13 = (WirePointer *)(pwVar3 + (local_38->ptr).size_),
                    (long)pwVar3 - (long)pWVar1 >> 3 <= lVar9 &&
                    (lVar9 <= (long)pWVar13 - (long)pWVar1 >> 3)))) {
                  pWVar13 = pWVar1 + lVar9;
                  goto LAB_0017e375;
                }
                goto LAB_0017e369;
              }
              iVar5 = (*local_38->arena->_vptr_Arena[2])
                                (local_38->arena,(ulong)(pWVar12->field_1).upper32Bits);
              newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar5);
              _kjCondition.left = &newSegment;
              _kjCondition.right = (void *)0x0;
              _kjCondition.op.content.ptr = " != ";
              _kjCondition.op.content.size_ = 5;
              _kjCondition.result = newSegment != (SegmentReader *)0x0;
              if (newSegment == (SegmentReader *)0x0) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                          ((Fault *)&size,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x25f,FAILED,"newSegment != nullptr",
                           "_kjCondition,\"Message contains double-far pointer to unknown segment.\""
                           ,&_kjCondition,
                           (char (*) [56])"Message contains double-far pointer to unknown segment.")
                ;
LAB_0017e799:
                pWVar13 = (WirePointer *)0x0;
                kj::_::Debug::Fault::~Fault((Fault *)&size);
              }
              else {
                uVar2 = (uint)*(uint64_t *)&(pWVar12->offsetAndKind).value;
                uVar8 = uVar2 & 3;
                _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar8);
                _kjCondition.right = " == ";
                _kjCondition.op.content.ptr = (char *)0x5;
                _kjCondition.op.content.size_ = (size_t)(uVar8 == 2);
                if (uVar8 != 2) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                            ((Fault *)&size,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                             "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                             (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                              *)&_kjCondition,
                             (char (*) [51])"Second word of double-far pad must be far pointer.");
                  goto LAB_0017e799;
                }
                uVar7 = (ulong)(uVar2 >> 3);
                sVar4 = (newSegment->ptr).size_;
                if ((long)sVar4 < (long)uVar7) {
                  uVar7 = sVar4;
                }
                pWVar13 = (WirePointer *)((newSegment->ptr).ptr + uVar7);
                local_38 = newSegment;
              }
              pWVar10 = pWVar12 + 1;
              goto LAB_0017e369;
            }
            (*local_38->arena->_vptr_Arena[3])();
          }
          newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                     "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [318])
                     "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
        }
        goto LAB_0017e661;
      }
LAB_0017e369:
      if (pWVar13 != (WirePointer *)0x0) goto LAB_0017e375;
    }
  }
LAB_0017e66d:
  pWVar13 = (WirePointer *)0x1f7432;
  if (defaultValue != (void *)0x0) {
    pWVar13 = (WirePointer *)defaultValue;
  }
  uVar7 = (ulong)defaultSize;
LAB_0017e67d:
  RVar15.super_StringPtr.content.size_ = uVar7 + 1;
  RVar15.super_StringPtr.content.ptr = (char *)pWVar13;
  return (Reader)RVar15.super_StringPtr.content;
}

Assistant:

Text::Reader PointerReader::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readTextPointer(segment, ref, defaultValue, defaultSize);
}